

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_metrics.hpp
# Opt level: O2

double __thiscall
notch::metrics::ConfusionMatrix<int,_1>::classAverage
          (ConfusionMatrix<int,_1> *this,function<double_(int)> *metric)

{
  pointer piVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  _Base_ptr p_Var3;
  int iVar4;
  pointer piVar5;
  double dVar6;
  double dVar7;
  int class_;
  _Rb_tree_color local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = 0;
  for (p_Var3 = (this->cm)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      piVar1 = local_48._M_impl.super__Vector_impl_data._M_finish,
      (_Rb_tree_header *)p_Var3 != &(this->cm)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_4c = p_Var3[1]._M_color;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (local_48._M_impl.super__Vector_impl_data._M_start,
                       local_48._M_impl.super__Vector_impl_data._M_finish,&local_4c);
    if (_Var2._M_current == local_48._M_impl.super__Vector_impl_data._M_finish) {
      core::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_48,(value_type_conflict2 *)&local_4c);
      iVar4 = iVar4 + 1;
    }
  }
  dVar7 = 0.0;
  for (piVar5 = local_48._M_impl.super__Vector_impl_data._M_start; piVar5 != piVar1;
      piVar5 = piVar5 + 1) {
    dVar6 = core::std::function<double_(int)>::operator()(metric,*piVar5);
    dVar7 = dVar7 + dVar6;
  }
  core::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return dVar7 / (double)iVar4;
}

Assistant:

double classAverage(std::function<double(C)> metric) {
        double sum = 0.0;
        int numClasses = 0;
        std::vector<C> uniq {};
        for (auto p : cm) { // find all uniq classes
            auto class_ = p.first.first;
            auto hasClass = std::find(uniq.begin(), uniq.end(), class_) != uniq.end();
            if (!hasClass) {
                uniq.push_back(class_);
                numClasses++;
            }
        }
        for (auto class_ : uniq) { // calculate the average
            double class_value = metric(class_);
            sum += class_value;
        }
        return sum / numClasses;
    }